

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void normalizePublicId(XML_Char *publicId)

{
  char cVar1;
  char *local_20;
  XML_Char *s;
  XML_Char *p;
  XML_Char *publicId_local;
  
  s = publicId;
  for (local_20 = publicId; *local_20 != '\0'; local_20 = local_20 + 1) {
    cVar1 = *local_20;
    if (((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 == ' ')) {
      if ((s != publicId) && (s[-1] != ' ')) {
        *s = ' ';
        s = s + 1;
      }
    }
    else {
      *s = *local_20;
      s = s + 1;
    }
  }
  if ((s != publicId) && (s[-1] == ' ')) {
    s = s + -1;
  }
  *s = '\0';
  return;
}

Assistant:

static void FASTCALL
normalizePublicId(XML_Char *publicId)
{
  XML_Char *p = publicId;
  XML_Char *s;
  for (s = publicId; *s; s++) {
    switch (*s) {
    case 0x20:
    case 0xD:
    case 0xA:
      if (p != publicId && p[-1] != 0x20)
        *p++ = 0x20;
      break;
    default:
      *p++ = *s;
    }
  }
  if (p != publicId && p[-1] == 0x20)
    --p;
  *p = XML_T('\0');
}